

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_string_range(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  TRef tr0;
  TRef TVar3;
  uint tr;
  GCstr *s;
  IRRef1 IVar4;
  IRRef1 IVar5;
  long lVar6;
  MSize MVar7;
  int k;
  long lVar8;
  int32_t start;
  uint local_4c;
  TRef local_48;
  TRef local_44;
  RecordFFData *local_40;
  GCstr *local_38;
  
  TVar1 = lj_ir_tostr(J,*J->base);
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130000;
  TVar2 = lj_opt_fold(J);
  tr0 = lj_ir_kint(J,0);
  local_38 = argv2str(J,rd->argv);
  local_48 = TVar1;
  if (rd->data == 0) {
    if ((*(byte *)((long)J->base + 7) & 0x1f) == 0) {
      local_4c = 1;
      TVar1 = lj_ir_kint(J,1);
    }
    else {
      local_4c = argv2int(J,rd->argv + 1);
      TVar1 = lj_opt_narrow_toint(J,J->base[1]);
    }
    MVar7 = local_4c;
    local_44 = TVar1;
    if ((J->base[1] == 0) || (tr = J->base[2], (tr & 0x1f000000) == 0)) goto LAB_0013a34c;
  }
  else {
    local_4c = argv2int(J,rd->argv + 1);
    local_44 = lj_opt_narrow_toint(J,J->base[1]);
    tr = J->base[2];
    if ((tr & 0x1f000000) == 0) {
      TVar1 = lj_ir_kint(J,-1);
      MVar7 = 0xffffffff;
      goto LAB_0013a34c;
    }
  }
  TVar1 = lj_opt_narrow_toint(J,tr);
  MVar7 = argv2int(J,rd->argv + 2);
LAB_0013a34c:
  s = local_38;
  IVar5 = (IRRef1)TVar2;
  IVar4 = (IRRef1)TVar1;
  local_40 = rd;
  if ((int)MVar7 < 0) {
    (J->fold).ins.field_0.ot = 0x93;
    (J->fold).ins.field_0.op1 = IVar4;
    (J->fold).ins.field_0.op2 = (IRRef1)tr0;
    lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = IVar5;
    (J->fold).ins.field_0.op2 = IVar4;
    TVar1 = lj_opt_fold(J);
    TVar3 = lj_ir_kint(J,1);
    (J->fold).ins.field_0.ot = 0x2913;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    TVar1 = lj_opt_fold(J);
    IVar4 = (IRRef1)TVar1;
    MVar7 = MVar7 + local_38->len + 1;
    s = local_38;
  }
  else {
    if (local_38->len < MVar7) {
      (J->fold).ins.field_0.ot = 0x793;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = IVar5;
      lj_opt_fold(J);
      MVar7 = s->len;
      TVar1 = TVar2;
    }
    else {
      (J->fold).ins.field_0.ot = 0x693;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = IVar5;
      lj_opt_fold(J);
    }
    IVar4 = (IRRef1)TVar1;
  }
  TVar1 = recff_string_start(J,s,(int32_t *)&local_4c,local_44,TVar2,tr0);
  IVar5 = (IRRef1)TVar1;
  if (local_40->data == 0) {
    k = MVar7 - local_4c;
    if (k < 1) {
      (J->fold).ins.field_0.ot = 0x293;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = IVar5;
      lj_opt_fold(J);
      local_40->nres = 0;
    }
    else {
      lVar6 = (long)k;
      (J->fold).ins.field_0.ot = 0x2a13;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = IVar5;
      TVar1 = lj_opt_fold(J);
      TVar2 = lj_ir_kint(J,k);
      (J->fold).ins.field_0.ot = 0x893;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
      lj_opt_fold(J);
      TVar1 = local_48;
      if (0xfa < (long)((ulong)J->baseslot + lVar6)) {
        lj_trace_err_info(J,LJ_TRERR_STACKOV);
      }
      local_40->nres = lVar6;
      lVar8 = 1;
      if (1 < lVar6) {
        lVar8 = lVar6;
      }
      lVar6 = 0;
      do {
        TVar2 = lj_ir_kint(J,(int32_t)lVar6);
        (J->fold).ins.field_0.ot = 0x2913;
        (J->fold).ins.field_0.op1 = IVar5;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
        TVar2 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x4009;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
        TVar2 = lj_opt_fold(J);
        (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x46100001;
        TVar2 = lj_opt_fold(J);
        J->base[lVar6] = TVar2;
        lVar6 = lVar6 + 1;
      } while (lVar8 != lVar6);
    }
  }
  else {
    if ((int)MVar7 < (int)local_4c) {
      (J->fold).ins.field_0.ot = 0x93;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = IVar5;
      lj_opt_fold(J);
      TVar1 = lj_ir_kgc(J,(GCobj *)(J[-1].penalty + 0x2c),IRT_STR);
    }
    else {
      (J->fold).ins.field_0.ot = 0x2a13;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = IVar5;
      TVar1 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x193;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      (J->fold).ins.field_0.op2 = (IRRef1)tr0;
      lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x4009;
      (J->fold).ins.field_0.op1 = (IRRef1)local_48;
      (J->fold).ins.field_0.op2 = IVar5;
      TVar2 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x4f04;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
      TVar1 = lj_opt_fold(J);
    }
    *J->base = TVar1;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_string_range(jit_State *J, RecordFFData *rd)
{
  TRef trstr = lj_ir_tostr(J, J->base[0]);
  TRef trlen = emitir(IRTI(IR_FLOAD), trstr, IRFL_STR_LEN);
  TRef tr0 = lj_ir_kint(J, 0);
  TRef trstart, trend;
  GCstr *str = argv2str(J, &rd->argv[0]);
  int32_t start, end;
  if (rd->data) {  /* string.sub(str, start [,end]) */
    start = argv2int(J, &rd->argv[1]);
    trstart = lj_opt_narrow_toint(J, J->base[1]);
    trend = J->base[2];
    if (tref_isnil(trend)) {
      trend = lj_ir_kint(J, -1);
      end = -1;
    } else {
      trend = lj_opt_narrow_toint(J, trend);
      end = argv2int(J, &rd->argv[2]);
    }
  } else {  /* string.byte(str, [,start [,end]]) */
    if (tref_isnil(J->base[1])) {
      start = 1;
      trstart = lj_ir_kint(J, 1);
    } else {
      start = argv2int(J, &rd->argv[1]);
      trstart = lj_opt_narrow_toint(J, J->base[1]);
    }
    if (J->base[1] && !tref_isnil(J->base[2])) {
      trend = lj_opt_narrow_toint(J, J->base[2]);
      end = argv2int(J, &rd->argv[2]);
    } else {
      trend = trstart;
      end = start;
    }
  }
  if (end < 0) {
    emitir(IRTGI(IR_LT), trend, tr0);
    trend = emitir(IRTI(IR_ADD), emitir(IRTI(IR_ADD), trlen, trend),
		   lj_ir_kint(J, 1));
    end = end+(int32_t)str->len+1;
  } else if ((MSize)end <= str->len) {
    emitir(IRTGI(IR_ULE), trend, trlen);
  } else {
    emitir(IRTGI(IR_UGT), trend, trlen);
    end = (int32_t)str->len;
    trend = trlen;
  }
  trstart = recff_string_start(J, str, &start, trstart, trlen, tr0);
  if (rd->data) {  /* Return string.sub result. */
    if (end - start >= 0) {
      /* Also handle empty range here, to avoid extra traces. */
      TRef trptr, trslen = emitir(IRTI(IR_SUB), trend, trstart);
      emitir(IRTGI(IR_GE), trslen, tr0);
      trptr = emitir(IRT(IR_STRREF, IRT_PGC), trstr, trstart);
      J->base[0] = emitir(IRT(IR_SNEW, IRT_STR), trptr, trslen);
    } else {  /* Range underflow: return empty string. */
      emitir(IRTGI(IR_LT), trend, trstart);
      J->base[0] = lj_ir_kstr(J, &J2G(J)->strempty);
    }
  } else {  /* Return string.byte result(s). */
    ptrdiff_t i, len = end - start;
    if (len > 0) {
      TRef trslen = emitir(IRTI(IR_SUB), trend, trstart);
      emitir(IRTGI(IR_EQ), trslen, lj_ir_kint(J, (int32_t)len));
      if (J->baseslot + len > LJ_MAX_JSLOTS)
	lj_trace_err_info(J, LJ_TRERR_STACKOV);
      rd->nres = len;
      for (i = 0; i < len; i++) {
	TRef tmp = emitir(IRTI(IR_ADD), trstart, lj_ir_kint(J, (int32_t)i));
	tmp = emitir(IRT(IR_STRREF, IRT_PGC), trstr, tmp);
	J->base[i] = emitir(IRT(IR_XLOAD, IRT_U8), tmp, IRXLOAD_READONLY);
      }
    } else {  /* Empty range or range underflow: return no results. */
      emitir(IRTGI(IR_LE), trend, trstart);
      rd->nres = 0;
    }
  }
}